

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeT2AddrModeSOReg(MCInst *Inst,uint Val,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t RegNo;
  uint32_t uVar3;
  uint uVar4;
  DecodeStatus DVar5;
  MCInst *in_RCX;
  uint32_t in_ESI;
  MCInst *in_RDI;
  uint imm;
  uint Rm;
  uint Rn;
  DecodeStatus S;
  undefined4 in_stack_ffffffffffffffb8;
  uint numBits;
  uint numBits_00;
  DecodeStatus local_4;
  
  local_4 = MCDisassembler_Success;
  numBits = 4;
  uVar2 = fieldFromInstruction_4(in_ESI,6,4);
  numBits_00 = 2;
  RegNo = fieldFromInstruction_4(in_ESI,2,numBits);
  uVar3 = fieldFromInstruction_4(in_ESI,0,numBits_00);
  uVar4 = MCInst_getOpcode(in_RDI);
  if ((((uVar4 == 0xa37) || (uVar4 == 0xa45)) || (uVar4 == 0xa4c)) && (uVar2 == 0xf)) {
    local_4 = MCDisassembler_Fail;
  }
  else {
    DVar5 = DecodeGPRRegisterClass
                      (in_RCX,local_4,CONCAT44(RegNo,uVar3),(void *)CONCAT44(uVar4,numBits_00));
    _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar5);
    if (_Var1) {
      DVar5 = DecoderGPRRegisterClass
                        ((MCInst *)CONCAT44(local_4,uVar2),RegNo,CONCAT44(uVar4,numBits_00),
                         (void *)CONCAT44(numBits,in_stack_ffffffffffffffb8));
      _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar5);
      if (_Var1) {
        MCOperand_CreateImm0(in_RDI,(ulong)uVar3);
      }
      else {
        local_4 = MCDisassembler_Fail;
      }
    }
    else {
      local_4 = MCDisassembler_Fail;
    }
  }
  return local_4;
}

Assistant:

static DecodeStatus DecodeT2AddrModeSOReg(MCInst *Inst, unsigned Val,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned Rn = fieldFromInstruction_4(Val, 6, 4);
	unsigned Rm = fieldFromInstruction_4(Val, 2, 4);
	unsigned imm = fieldFromInstruction_4(Val, 0, 2);

	// Thumb stores cannot use PC as dest register.
	switch (MCInst_getOpcode(Inst)) {
		case ARM_t2STRHs:
		case ARM_t2STRBs:
		case ARM_t2STRs:
			if (Rn == 15)
				return MCDisassembler_Fail;
		default:
			break;
	}

	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecoderGPRRegisterClass(Inst, Rm, Address, Decoder)))
		return MCDisassembler_Fail;
	MCOperand_CreateImm0(Inst, imm);

	return S;
}